

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O1

void __thiscall RtMidiIn::RtMidiIn(RtMidiIn *this,Api api,string *clientName,uint queueSizeLimit)

{
  MidiApi *pMVar1;
  bool bVar2;
  int iVar3;
  RtMidiError *this_00;
  ulong uVar4;
  ulong uVar5;
  vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> apis;
  string errorText;
  vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> local_58;
  string local_40;
  
  (this->super_RtMidi).rtapi_ = (MidiApi *)0x0;
  (this->super_RtMidi)._vptr_RtMidi = (_func_int **)&PTR_openPort_00110978;
  if (api != UNSPECIFIED) {
    openMidiApi(this,api,clientName,queueSizeLimit);
    if ((this->super_RtMidi).rtapi_ != (MidiApi *)0x0) {
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "\nRtMidiIn: no compiled support for specified API argument!\n\n",0x3c);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
  }
  local_58.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  RtMidi::getCompiledApi(&local_58);
  if (local_58.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_58.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      openMidiApi(this,local_58.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar4],clientName,queueSizeLimit);
      pMVar1 = (this->super_RtMidi).rtapi_;
      if ((pMVar1 != (MidiApi *)0x0) && (iVar3 = (*pMVar1->_vptr_MidiApi[8])(), iVar3 != 0)) break;
      bVar2 = uVar5 < (ulong)((long)local_58.
                                    super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_58.
                                    super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2);
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar2);
  }
  if ((this->super_RtMidi).rtapi_ != (MidiApi *)0x0) {
    if (local_58.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)local_58.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"RtMidiIn: no compiled API support found ... critical error!!","");
  this_00 = (RtMidiError *)__cxa_allocate_exception(0x30);
  RtMidiError::RtMidiError(this_00,&local_40,UNSPECIFIED);
  __cxa_throw(this_00,&RtMidiError::typeinfo,RtMidiError::~RtMidiError);
}

Assistant:

RTMIDI_DLL_PUBLIC RtMidiIn :: RtMidiIn( RtMidi::Api api, const std::string &clientName, unsigned int queueSizeLimit )
  : RtMidi()
{
  if ( api != UNSPECIFIED ) {
    // Attempt to open the specified API.
    openMidiApi( api, clientName, queueSizeLimit );
    if ( rtapi_ ) return;

    // No compiled support for specified API value.  Issue a warning
    // and continue as if no API was specified.
    std::cerr << "\nRtMidiIn: no compiled support for specified API argument!\n\n" << std::endl;
  }

  // Iterate through the compiled APIs and return as soon as we find
  // one with at least one port or we reach the end of the list.
  std::vector< RtMidi::Api > apis;
  getCompiledApi( apis );
  for ( unsigned int i=0; i<apis.size(); i++ ) {
    openMidiApi( apis[i], clientName, queueSizeLimit );
    if ( rtapi_ && rtapi_->getPortCount() ) break;
  }

  if ( rtapi_ ) return;

  // It should not be possible to get here because the preprocessor
  // definition __RTMIDI_DUMMY__ is automatically defined if no
  // API-specific definitions are passed to the compiler. But just in
  // case something weird happens, we'll throw an error.
  std::string errorText = "RtMidiIn: no compiled API support found ... critical error!!";
  throw( RtMidiError( errorText, RtMidiError::UNSPECIFIED ) );
}